

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeNEONModImmInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  DecodeStatus DVar9;
  uint uVar10;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Rd;
  uint Q;
  uint imm;
  DecodeStatus S;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  DecodeStatus local_4;
  
  local_4 = MCDisassembler_Success;
  uVar2 = fieldFromInstruction_4(in_ESI,0xc,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x16,1);
  uVar4 = uVar3 << 4 | uVar2;
  uVar2 = fieldFromInstruction_4(in_ESI,0,4);
  uVar3 = fieldFromInstruction_4(in_ESI,0x10,3);
  uVar5 = fieldFromInstruction_4(in_ESI,0x18,1);
  uVar6 = fieldFromInstruction_4(in_ESI,8,4);
  uVar7 = fieldFromInstruction_4(in_ESI,5,1);
  uVar8 = fieldFromInstruction_4(in_ESI,6,1);
  if (uVar8 == 0) {
    DVar9 = DecodeDPRRegisterClass
                      (in_RCX,local_4,(ulong)uVar4,
                       (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar9);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  else {
    DVar9 = DecodeQPRRegisterClass
                      (in_RCX,local_4,CONCAT44(uVar8,uVar4),
                       (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar9);
    if (!_Var1) {
      return MCDisassembler_Fail;
    }
  }
  MCOperand_CreateImm0(in_RDI,(ulong)(uVar7 << 0xc | uVar6 << 8 | uVar5 << 7 | uVar3 << 4 | uVar2));
  uVar10 = MCInst_getOpcode(in_RDI);
  if (uVar10 - 0x25e < 2) {
LAB_0029a76a:
    DVar9 = DecodeDPRRegisterClass
                      (in_RCX,local_4,CONCAT44(uVar8,uVar4),
                       (void *)CONCAT44(uVar10,in_stack_ffffffffffffffc0));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar9);
    if (!_Var1) {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    if (1 < uVar10 - 0x260) {
      if (uVar10 - 0x5a9 < 2) goto LAB_0029a76a;
      if (1 < uVar10 - 0x5ab) {
        return local_4;
      }
    }
    DVar9 = DecodeQPRRegisterClass
                      (in_RCX,local_4,CONCAT44(uVar8,uVar4),
                       (void *)CONCAT44(uVar10,in_stack_ffffffffffffffc0));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar9);
    if (!_Var1) {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeNEONModImmInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned imm, Q;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	imm = fieldFromInstruction_4(Insn, 0, 4);
	imm |= fieldFromInstruction_4(Insn, 16, 3) << 4;
	imm |= fieldFromInstruction_4(Insn, 24, 1) << 7;
	imm |= fieldFromInstruction_4(Insn, 8, 4) << 8;
	imm |= fieldFromInstruction_4(Insn, 5, 1) << 12;
	Q = fieldFromInstruction_4(Insn, 6, 1);

	if (Q) {
		if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	} else {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	MCOperand_CreateImm0(Inst, imm);

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VORRiv4i16:
		case ARM_VORRiv2i32:
		case ARM_VBICiv4i16:
		case ARM_VBICiv2i32:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VORRiv8i16:
		case ARM_VORRiv4i32:
		case ARM_VBICiv8i16:
		case ARM_VBICiv4i32:
			if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}